

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.hpp
# Opt level: O2

void __thiscall trng::mrg2::split(mrg2 *this,uint s,uint n)

{
  int iVar1;
  int iVar2;
  ulong s_00;
  int iVar3;
  bool bVar4;
  result_type b [4];
  result_type a [2];
  
  s_00 = (ulong)s;
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)b,"invalid argument for trng::mrg2::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)b);
    std::invalid_argument::~invalid_argument((invalid_argument *)b);
  }
  if (1 < s) {
    jump(this,(ulong)n + 1);
    iVar3 = (this->S).r[0];
    jump(this,s_00);
    iVar1 = (this->S).r[0];
    jump(this,s_00);
    iVar2 = (this->S).r[0];
    jump(this,s_00);
    a[1] = (this->S).r[0];
    b[0] = iVar1;
    b[1] = iVar3;
    b[2] = iVar2;
    b[3] = iVar1;
    a[0] = iVar2;
    int_math::gauss<2>(&b,&a,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(a[1],a[0]);
    (this->S).r[0] = iVar1;
    (this->S).r[1] = iVar3;
    iVar3 = 2;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      backward(this);
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg2::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::mrg2::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const result_type q0{S.r[0]};
      jump(s);
      const result_type q1{S.r[0]};
      jump(s);
      const result_type q2{S.r[0]};
      jump(s);
      const result_type q3{S.r[0]};
      result_type a[2], b[4];
      a[0] = q2;
      b[0] = q1;
      b[1] = q0;
      a[1] = q3;
      b[2] = q2;
      b[3] = q1;
      int_math::gauss<2>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      S.r[0] = q1;
      S.r[1] = q0;
      for (int i{0}; i < 2; ++i)
        backward();
    }
  }